

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<double,1,4,1,1,4>,Eigen::Matrix<double,1,4,1,1,4>,Eigen::internal::swap_assign_op<double>>
               (Matrix<double,_1,_4,_1,_1,_4> *dst,Matrix<double,_1,_4,_1,_1,_4> *src,
               swap_assign_op<double> *func)

{
  ActualDstType actualDst;
  swap_assign_op<double> *func_local;
  Matrix<double,_1,_4,_1,_1,_4> *src_local;
  Matrix<double,_1,_4,_1,_1,_4> *dst_local;
  
  Assignment<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::internal::swap_assign_op<double>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);
  
  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);
  
  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}